

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void substSelect(SubstContext *pSubst,Select *p,int doPrior)

{
  ExprList *pEVar1;
  bool bVar2;
  ushort uVar3;
  Expr *pEVar4;
  long lVar5;
  ExprList_item *pEVar6;
  SrcItem *pSVar7;
  int iVar8;
  
  if (p != (Select *)0x0) {
    do {
      pEVar1 = p->pEList;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar6 = pEVar1->a;
        lVar5 = 0;
        do {
          pEVar4 = substExpr(pSubst,pEVar6->pExpr);
          pEVar6->pExpr = pEVar4;
          lVar5 = lVar5 + 1;
          pEVar6 = pEVar6 + 1;
        } while (lVar5 < pEVar1->nExpr);
      }
      pEVar1 = p->pGroupBy;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar6 = pEVar1->a;
        lVar5 = 0;
        do {
          pEVar4 = substExpr(pSubst,pEVar6->pExpr);
          pEVar6->pExpr = pEVar4;
          lVar5 = lVar5 + 1;
          pEVar6 = pEVar6 + 1;
        } while (lVar5 < pEVar1->nExpr);
      }
      pEVar1 = p->pOrderBy;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar6 = pEVar1->a;
        lVar5 = 0;
        do {
          pEVar4 = substExpr(pSubst,pEVar6->pExpr);
          pEVar6->pExpr = pEVar4;
          lVar5 = lVar5 + 1;
          pEVar6 = pEVar6 + 1;
        } while (lVar5 < pEVar1->nExpr);
      }
      pEVar4 = substExpr(pSubst,p->pHaving);
      p->pHaving = pEVar4;
      pEVar4 = substExpr(pSubst,p->pWhere);
      p->pWhere = pEVar4;
      iVar8 = p->pSrc->nSrc;
      if (0 < iVar8) {
        pSVar7 = p->pSrc->a;
        do {
          uVar3 = *(ushort *)&(pSVar7->fg).field_0x1;
          if ((uVar3 & 4) != 0) {
            substSelect(pSubst,((pSVar7->u4).pSubq)->pSelect,1);
            uVar3 = *(ushort *)&(pSVar7->fg).field_0x1;
          }
          if ((((uVar3 & 8) != 0) && (pEVar1 = (pSVar7->u1).pFuncArg, pEVar1 != (ExprList *)0x0)) &&
             (0 < pEVar1->nExpr)) {
            pEVar6 = pEVar1->a;
            lVar5 = 0;
            do {
              pEVar4 = substExpr(pSubst,pEVar6->pExpr);
              pEVar6->pExpr = pEVar4;
              lVar5 = lVar5 + 1;
              pEVar6 = pEVar6 + 1;
            } while (lVar5 < pEVar1->nExpr);
          }
          pSVar7 = pSVar7 + 1;
          bVar2 = 1 < iVar8;
          iVar8 = iVar8 + -1;
        } while (bVar2);
      }
    } while ((doPrior != 0) && (p = p->pPrior, p != (Select *)0x0));
  }
  return;
}

Assistant:

static void substSelect(
  SubstContext *pSubst, /* Description of the substitution */
  Select *p,            /* SELECT statement in which to make substitutions */
  int doPrior           /* Do substitutes on p->pPrior too */
){
  SrcList *pSrc;
  SrcItem *pItem;
  int i;
  if( !p ) return;
  do{
    substExprList(pSubst, p->pEList);
    substExprList(pSubst, p->pGroupBy);
    substExprList(pSubst, p->pOrderBy);
    p->pHaving = substExpr(pSubst, p->pHaving);
    p->pWhere = substExpr(pSubst, p->pWhere);
    pSrc = p->pSrc;
    assert( pSrc!=0 );
    for(i=pSrc->nSrc, pItem=pSrc->a; i>0; i--, pItem++){
      if( pItem->fg.isSubquery ){
        substSelect(pSubst, pItem->u4.pSubq->pSelect, 1);
      }
      if( pItem->fg.isTabFunc ){
        substExprList(pSubst, pItem->u1.pFuncArg);
      }
    }
  }while( doPrior && (p = p->pPrior)!=0 );
}